

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O2

Error __thiscall
asmjit::RAInstBuilder::add
          (RAInstBuilder *this,RAWorkReg *workReg,uint32_t flags,uint32_t allocable,uint32_t useId,
          uint32_t useRewriteMask,uint32_t outId,uint32_t outRewriteMask,uint32_t rmSize)

{
  byte bVar1;
  RATiedReg *pRVar2;
  uint32_t *puVar3;
  byte bVar4;
  uint index;
  
  index = (workReg->_info)._signature >> 8 & 0xf;
  pRVar2 = workReg->_tiedReg;
  bVar1 = (byte)useId;
  if (useId != 0xff) {
    (this->_stats)._packed = (this->_stats)._packed | 0x100 << (sbyte)index;
    puVar3 = RARegMask::operator[](&this->_used,index);
    *puVar3 = *puVar3 | 1 << (bVar1 & 0x1f);
    flags = flags | 0x1000;
  }
  bVar4 = (byte)outId;
  if (outId != 0xff) {
    puVar3 = RARegMask::operator[](&this->_clobbered,index);
    *puVar3 = *puVar3 | 1 << (bVar4 & 0x1f);
    flags = flags | 0x2000;
  }
  this->_aggregatedFlags = this->_aggregatedFlags | flags;
  (this->_stats)._packed = (this->_stats)._packed | 1 << (sbyte)index;
  if (pRVar2 == (RATiedReg *)0x0) {
    pRVar2 = this->_cur;
    if ((((long)pRVar2 + (-0x38 - (long)this)) / 0x18 & 0xffffff80U) != 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/../core/rapass_p.h"
                 ,0x1e2,"tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs)");
    }
    this->_cur = pRVar2 + 1;
    pRVar2->_workId = workReg->_workId;
    pRVar2->_flags = flags;
    pRVar2->_allocableRegs = allocable;
    pRVar2->_useRewriteMask = useRewriteMask;
    pRVar2->_outRewriteMask = outRewriteMask;
    (pRVar2->field_5).field_0._refCount = '\x01';
    (pRVar2->field_5).field_0._useId = bVar1;
    (pRVar2->field_5).field_0._outId = bVar4;
    (pRVar2->field_5).field_0._rmSize = (byte)rmSize;
    workReg->_tiedReg = pRVar2;
    RARegCount::add(&this->_count,index,1);
  }
  else {
    if (useId != 0xff) {
      if ((pRVar2->field_5).field_0._useId != 0xff) {
        return 0x41;
      }
      (pRVar2->field_5).field_0._useId = bVar1;
    }
    if (outId != 0xff) {
      if ((pRVar2->field_5).field_0._outId != 0xff) {
        return 0x41;
      }
      (pRVar2->field_5).field_0._outId = bVar4;
    }
    (pRVar2->field_5).field_0._refCount = (pRVar2->field_5).field_0._refCount + '\x01';
    pRVar2->_flags = pRVar2->_flags | flags;
    pRVar2->_allocableRegs = pRVar2->_allocableRegs & allocable;
    pRVar2->_useRewriteMask = pRVar2->_useRewriteMask | useRewriteMask;
    pRVar2->_outRewriteMask = pRVar2->_outRewriteMask | outRewriteMask;
    bVar1 = (pRVar2->field_5).field_0._rmSize;
    bVar4 = (byte)rmSize;
    if (rmSize < bVar1) {
      bVar4 = bVar1;
    }
    (pRVar2->field_5).field_0._rmSize = bVar4;
  }
  return 0;
}

Assistant:

Error add(RAWorkReg* workReg, uint32_t flags, uint32_t allocable, uint32_t useId, uint32_t useRewriteMask, uint32_t outId, uint32_t outRewriteMask, uint32_t rmSize = 0) noexcept {
    uint32_t group = workReg->group();
    RATiedReg* tiedReg = workReg->tiedReg();

    if (useId != BaseReg::kIdBad) {
      _stats.makeFixed(group);
      _used[group] |= Support::bitMask(useId);
      flags |= RATiedReg::kUseFixed;
    }

    if (outId != BaseReg::kIdBad) {
      _clobbered[group] |= Support::bitMask(outId);
      flags |= RATiedReg::kOutFixed;
    }

    _aggregatedFlags |= flags;
    _stats.makeUsed(group);

    if (!tiedReg) {
      // Could happen when the builder is not reset properly after each instruction.
      ASMJIT_ASSERT(tiedRegCount() < ASMJIT_ARRAY_SIZE(_tiedRegs));

      tiedReg = _cur++;
      tiedReg->init(workReg->workId(), flags, allocable, useId, useRewriteMask, outId, outRewriteMask, rmSize);
      workReg->setTiedReg(tiedReg);

      _count.add(group);
      return kErrorOk;
    }
    else {
      if (useId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasUseId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setUseId(useId);
      }

      if (outId != BaseReg::kIdBad) {
        if (ASMJIT_UNLIKELY(tiedReg->hasOutId()))
          return DebugUtils::errored(kErrorOverlappedRegs);
        tiedReg->setOutId(outId);
      }

      tiedReg->addRefCount();
      tiedReg->addFlags(flags);
      tiedReg->_allocableRegs &= allocable;
      tiedReg->_useRewriteMask |= useRewriteMask;
      tiedReg->_outRewriteMask |= outRewriteMask;
      tiedReg->_rmSize = uint8_t(Support::max<uint32_t>(tiedReg->rmSize(), rmSize));
      return kErrorOk;
    }
  }